

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraHot.c
# Opt level: O0

void Fra_OneHotCheck(Fra_Man_t *p,Vec_Int_t *vOneHots)

{
  Aig_Man_t *pAVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Aig_Obj_t *pOld;
  Aig_Obj_t *pNew;
  int nTruePos;
  int Out2;
  int Out1;
  int i;
  int RetValue;
  Aig_Obj_t *pObj2;
  Aig_Obj_t *pObj1;
  Vec_Int_t *vOneHots_local;
  Fra_Man_t *p_local;
  
  iVar2 = Aig_ManCoNum(p->pManFraig);
  iVar3 = Aig_ManRegNum(p->pManFraig);
  Out2 = 0;
  do {
    iVar4 = Vec_IntSize(vOneHots);
    if (iVar4 <= Out2) {
      return;
    }
    iVar4 = Vec_IntEntry(vOneHots,Out2);
    iVar5 = Vec_IntEntry(vOneHots,Out2 + 1);
    if ((iVar4 != 0) || (iVar5 != 0)) {
      pAVar1 = p->pManFraig;
      iVar6 = Fra_LitReg(iVar4);
      pOld = Aig_ManCo(pAVar1,(iVar2 - iVar3) + iVar6);
      pAVar1 = p->pManFraig;
      iVar6 = Fra_LitReg(iVar5);
      pNew = Aig_ManCo(pAVar1,(iVar2 - iVar3) + iVar6);
      iVar4 = Fra_LitSign(iVar4);
      iVar5 = Fra_LitSign(iVar5);
      iVar4 = Fra_NodesAreClause(p,pOld,pNew,iVar4,iVar5);
      if (iVar4 != 1) {
        p->pCla->fRefinement = 1;
        if (iVar4 == 0) {
          Fra_SmlResimulate(p);
        }
        iVar4 = Vec_IntEntry(vOneHots,Out2);
        if (iVar4 != 0) {
          printf("Fra_OneHotCheck(): Clause is not refined!\n");
        }
        iVar4 = Vec_IntEntry(vOneHots,Out2);
        if (iVar4 != 0) {
          __assert_fail("Vec_IntEntry(vOneHots, i) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraHot.c"
                        ,0xfa,"void Fra_OneHotCheck(Fra_Man_t *, Vec_Int_t *)");
        }
      }
    }
    Out2 = Out2 + 2;
  } while( true );
}

Assistant:

void Fra_OneHotCheck( Fra_Man_t * p, Vec_Int_t * vOneHots )
{
    Aig_Obj_t * pObj1, * pObj2;
    int RetValue, i, Out1, Out2;
    int nTruePos = Aig_ManCoNum(p->pManFraig) - Aig_ManRegNum(p->pManFraig);
    for ( i = 0; i < Vec_IntSize(vOneHots); i += 2 )
    {
        Out1 = Vec_IntEntry( vOneHots, i );
        Out2 = Vec_IntEntry( vOneHots, i+1 );
        if ( Out1 == 0 && Out2 == 0 )
            continue;
        pObj1 = Aig_ManCo( p->pManFraig, nTruePos + Fra_LitReg(Out1) );
        pObj2 = Aig_ManCo( p->pManFraig, nTruePos + Fra_LitReg(Out2) );
        RetValue = Fra_NodesAreClause( p, pObj1, pObj2, Fra_LitSign(Out1), Fra_LitSign(Out2) );
        if ( RetValue != 1 )
        {
            p->pCla->fRefinement = 1;
            if ( RetValue == 0 )
                Fra_SmlResimulate( p );
            if ( Vec_IntEntry(vOneHots, i) != 0 )
                printf( "Fra_OneHotCheck(): Clause is not refined!\n" );
            assert( Vec_IntEntry(vOneHots, i) == 0 );
        }
    }
}